

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths_unix.cpp
# Opt level: O1

QStringList * xdgDataDirs(void)

{
  Data *pDVar1;
  int *piVar2;
  Data *pDVar3;
  QString *data;
  QString *pQVar4;
  ulong uVar5;
  long lVar6;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  bool bVar7;
  QArrayData *d;
  QArrayDataPointer<QString> local_b0;
  QString local_98;
  QArrayDataPointer<QString> local_78;
  char16_t *local_58 [3];
  long local_40;
  char16_t *local_38;
  qsizetype local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  qEnvironmentVariable(&local_98,"XDG_DATA_DIRS");
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  dirsList(in_RDI,&local_98);
  if ((in_RDI->d).size == 0) {
    local_58[0] = (char16_t *)0x0;
    local_58[1] = L"/usr/local/share";
    local_58[2] = (char16_t *)0x10;
    local_40 = 0;
    local_38 = L"/usr/share";
    local_30 = 10;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = (QString *)QArrayData::allocate((QArrayData **)&local_78,0x18,0x10,2,KeepSize);
    local_b0.size = 0;
    uVar5 = 0xffffffffffffffe8;
    do {
      pDVar1 = *(Data **)((long)local_58 + uVar5 + 0x18);
      pQVar4[local_b0.size].d.d = pDVar1;
      pQVar4[local_b0.size].d.ptr = *(char16_t **)((long)local_58 + uVar5 + 0x20);
      pQVar4[local_b0.size].d.size = *(qsizetype *)((long)&local_30 + uVar5);
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      lVar6 = local_b0.size + 1;
      bVar7 = 0xffffffffffffffe7 < uVar5;
      uVar5 = uVar5 + 0x18;
      local_b0.size = lVar6;
    } while (bVar7);
    local_b0.d = (Data *)0x0;
    local_b0.ptr = (QString *)0x0;
    local_b0.size = 0;
    pDVar3 = (in_RDI->d).d;
    local_78.ptr = (in_RDI->d).ptr;
    (in_RDI->d).d = local_78.d;
    (in_RDI->d).ptr = pQVar4;
    local_78.size = (in_RDI->d).size;
    (in_RDI->d).size = lVar6;
    local_78.d = pDVar3;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_b0);
    lVar6 = 0x18;
    do {
      piVar2 = *(int **)((long)local_58 + lVar6);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate(*(QArrayData **)((long)local_58 + lVar6),2,0x10);
        }
      }
      lVar6 = lVar6 + -0x18;
    } while (lVar6 != -0x18);
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QStringList xdgDataDirs()
{
    // http://standards.freedesktop.org/basedir-spec/latest/
    QString xdgDataDirsEnv = qEnvironmentVariable("XDG_DATA_DIRS");

    QStringList dirs = dirsList(xdgDataDirsEnv);
    if (dirs.isEmpty())
        dirs = QStringList{u"/usr/local/share"_s, u"/usr/share"_s};

    return dirs;
}